

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

bool __thiscall dxil_spv::CFGNode::post_dominates_perfect_structured_construct(CFGNode *this)

{
  pointer ppCVar1;
  bool bVar2;
  bool bVar3;
  pointer ppCVar4;
  
  bVar2 = post_dominates(this,this->immediate_dominator);
  if (bVar2) {
    ppCVar4 = (this->pred).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppCVar1 = (this->pred).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar2 = ppCVar4 == ppCVar1;
      if (bVar2) {
        return bVar2;
      }
      bVar3 = post_dominates(this,*ppCVar4);
      ppCVar4 = ppCVar4 + 1;
    } while (bVar3);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool CFGNode::post_dominates_perfect_structured_construct() const
{
	if (!post_dominates(immediate_dominator))
		return false;

	for (auto *p : pred)
		if (!post_dominates(p))
			return false;
	return true;
}